

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void it_retrigger_note(DUMB_IT_SIGRENDERER *sigrenderer,IT_CHANNEL *channel)

{
  uchar uVar1;
  DUMB_IT_SIGDATA *pDVar2;
  bool bVar3;
  int iVar4;
  IT_PLAYING *pIVar5;
  IT_CHANNEL *in_RSI;
  DUMB_IT_SIGRENDERER *in_RDI;
  bool bVar6;
  bool bVar7;
  IT_INSTRUMENT *instrument;
  IT_PLAYING *playing_2;
  IT_PLAYING *playing_1;
  int match;
  IT_PLAYING *playing;
  int envelopes_copied;
  int i;
  uchar nna;
  DUMB_IT_SIGDATA *sigdata;
  int pitch_env_tick;
  int pan_env_tick;
  int vol_env_tick;
  DUMB_IT_SIGRENDERER *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff9c;
  IT_INSTRUMENT *in_stack_ffffffffffffffa0;
  int local_30;
  byte local_29;
  int local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  pDVar2 = in_RDI->sigdata;
  local_29 = 0xff;
  bVar3 = false;
  if (in_RSI->playing != (IT_PLAYING *)0x0) {
    if (in_RSI->note == 0xfe) {
      local_29 = 0;
    }
    else if (in_RSI->note == 0xff) {
      local_29 = 2;
    }
    else if (in_RSI->note < 0x79) {
      if ((in_RSI->playing->instrument == (IT_INSTRUMENT *)0x0) ||
         ((in_RSI->playing->flags & 8U) != 0)) {
        local_29 = 0;
      }
      else if (in_RSI->new_note_action == 0xff) {
        local_29 = in_RSI->playing->instrument->new_note_action;
      }
      else {
        local_29 = in_RSI->new_note_action;
      }
    }
    else {
      local_29 = 3;
    }
    if ((in_RSI->playing->flags & 2U) == 0) {
      if (local_29 != 0) {
        local_14 = (in_RSI->playing->volume_envelope).tick;
      }
      local_18 = (in_RSI->playing->pan_envelope).tick;
      local_1c = (in_RSI->playing->pitch_envelope).tick;
      bVar3 = true;
    }
    in_stack_ffffffffffffff9c = (uint)local_29;
    if (in_stack_ffffffffffffff9c == 0) {
      in_RSI->playing->declick_stage = '\x03';
    }
    else if (in_stack_ffffffffffffff9c == 2) {
      it_note_off((IT_PLAYING *)0x8613eb);
    }
    else if (in_stack_ffffffffffffff9c == 3) {
      in_RSI->playing->flags = in_RSI->playing->flags | 5;
    }
  }
  in_RSI->new_note_action = 0xff;
  if ((in_RSI->sample != 0) && (in_RSI->note < 0x79)) {
    in_RSI->destnote = 0xff;
    if (in_RSI->playing != (IT_PLAYING *)0x0) {
      for (local_30 = 0; local_30 < 0xc0; local_30 = local_30 + 1) {
        if (in_RDI->playing[local_30] == (IT_PLAYING *)0x0) {
          in_RDI->playing[local_30] = in_RSI->playing;
          in_RSI->playing = (IT_PLAYING *)0x0;
          break;
        }
      }
      if ((in_RDI->sigdata->flags & 4U) != 0) {
        for (local_30 = 0; local_30 < 0xc0; local_30 = local_30 + 1) {
          pIVar5 = in_RDI->playing[local_30];
          if (((pIVar5 != (IT_PLAYING *)0x0) && (pIVar5->channel == in_RSI)) &&
             (pIVar5->instrument->dup_check_type != '\0')) {
            bVar7 = true;
            uVar1 = pIVar5->instrument->dup_check_type;
            if (uVar1 == '\x01') {
              bVar7 = in_RSI->truenote == pIVar5->note;
LAB_00861587:
              bVar6 = false;
              if (bVar7) {
                bVar6 = in_RSI->sample == pIVar5->sampnum;
              }
LAB_008615bc:
              bVar7 = false;
              if (bVar6) {
                bVar7 = in_RSI->instrument == pIVar5->instnum;
              }
            }
            else {
              if (uVar1 == '\x02') goto LAB_00861587;
              bVar6 = bVar7;
              if (uVar1 == '\x03') goto LAB_008615bc;
            }
            if (bVar7) {
              uVar1 = pIVar5->instrument->dup_check_action;
              if (uVar1 == '\0') {
                pIVar5->declick_stage = '\x03';
                if (in_RSI->playing == pIVar5) {
                  in_RSI->playing = (IT_PLAYING *)0x0;
                }
              }
              else if (uVar1 == '\x01') {
                if ((pIVar5->flags & 2U) == 0) {
                  it_note_off((IT_PLAYING *)0x861673);
                }
              }
              else if (uVar1 == '\x02') {
                pIVar5->flags = pIVar5->flags | 5;
              }
            }
          }
        }
      }
    }
    if (in_RSI->playing != (IT_PLAYING *)0x0) {
      free_playing(in_RDI,in_RSI->playing);
    }
    pIVar5 = new_playing(in_stack_ffffffffffffff88);
    in_RSI->playing = pIVar5;
    if (in_RSI->playing != (IT_PLAYING *)0x0) {
      if ((!bVar3) && ((pDVar2->flags & 4U) != 0)) {
        for (local_30 = 0; local_30 < 0xc0; local_30 = local_30 + 1) {
          pIVar5 = in_RDI->playing[local_30];
          if (((pIVar5 != (IT_PLAYING *)0x0) && (pIVar5->channel == in_RSI)) &&
             ((pIVar5->flags & 2U) == 0)) {
            if (local_29 != 0) {
              local_14 = (pIVar5->volume_envelope).tick;
            }
            local_18 = (pIVar5->pan_envelope).tick;
            local_1c = (pIVar5->pitch_envelope).tick;
            bVar3 = true;
            break;
          }
        }
      }
      in_RSI->playing->flags = 0;
      in_RSI->playing->resampling_quality = in_RDI->resampling_quality;
      in_RSI->playing->channel = in_RSI;
      in_RSI->playing->sample = pDVar2->sample + (int)(in_RSI->sample - 1);
      if ((pDVar2->flags & 4U) == 0) {
        in_RSI->playing->instrument = (IT_INSTRUMENT *)0x0;
      }
      else {
        in_RSI->playing->instrument = pDVar2->instrument + (int)(in_RSI->instrument - 1);
      }
      in_RSI->playing->env_instrument = in_RSI->playing->instrument;
      in_RSI->playing->sampnum = in_RSI->sample;
      in_RSI->playing->instnum = in_RSI->instrument;
      in_RSI->playing->declick_stage = '\0';
      in_RSI->playing->channel_volume = in_RSI->channelvolume;
      in_RSI->playing->note = in_RSI->truenote;
      in_RSI->playing->enabled_envelopes = '\0';
      in_RSI->playing->volume_offset = '\0';
      in_RSI->playing->panning_offset = '\0';
      if ((pDVar2->flags & 4U) != 0) {
        pIVar5 = in_RSI->playing;
        in_stack_ffffffffffffffa0 = pIVar5->instrument;
        if (((in_stack_ffffffffffffffa0->volume_envelope).flags & 1) != 0) {
          pIVar5->enabled_envelopes = pIVar5->enabled_envelopes | 1;
        }
        if (((in_stack_ffffffffffffffa0->pan_envelope).flags & 1) != 0) {
          pIVar5->enabled_envelopes = pIVar5->enabled_envelopes | 2;
        }
        if (((in_stack_ffffffffffffffa0->pitch_envelope).flags & 1) != 0) {
          pIVar5->enabled_envelopes = pIVar5->enabled_envelopes | 4;
        }
        if (in_stack_ffffffffffffffa0->random_volume != '\0') {
          iVar4 = rand();
          pIVar5->volume_offset =
               (char)(iVar4 % (int)((uint)in_stack_ffffffffffffffa0->random_volume * 2 + 1)) -
               in_stack_ffffffffffffffa0->random_volume;
        }
        if (in_stack_ffffffffffffffa0->random_pan != '\0') {
          iVar4 = rand();
          pIVar5->panning_offset =
               (char)(iVar4 % (int)((uint)in_stack_ffffffffffffffa0->random_pan * 2 + 1)) -
               in_stack_ffffffffffffffa0->random_pan;
        }
      }
      in_RSI->playing->filter_cutoff = '\x7f';
      in_RSI->playing->filter_resonance = '\0';
      in_RSI->playing->true_filter_cutoff = 0x7f00;
      in_RSI->playing->true_filter_resonance = '\0';
      in_RSI->playing->vibrato_speed = '\0';
      in_RSI->playing->vibrato_depth = '\0';
      in_RSI->playing->vibrato_n = '\0';
      in_RSI->playing->vibrato_time = '\0';
      in_RSI->playing->vibrato_waveform = in_RSI->vibrato_waveform;
      in_RSI->playing->tremolo_speed = '\0';
      in_RSI->playing->tremolo_depth = '\0';
      in_RSI->playing->tremolo_time = '\0';
      in_RSI->playing->tremolo_waveform = in_RSI->tremolo_waveform;
      in_RSI->playing->panbrello_speed = '\0';
      in_RSI->playing->panbrello_depth = '\0';
      in_RSI->playing->panbrello_time = '\0';
      in_RSI->playing->panbrello_waveform = in_RSI->panbrello_waveform;
      in_RSI->playing->panbrello_random = '\0';
      in_RSI->playing->sample_vibrato_time = '\0';
      in_RSI->playing->sample_vibrato_waveform = in_RSI->playing->sample->vibrato_waveform;
      in_RSI->playing->sample_vibrato_depth = 0;
      in_RSI->playing->slide = 0;
      in_RSI->playing->finetune = (int)in_RSI->playing->sample->finetune;
      if ((pDVar2->flags & 4U) != 0) {
        if ((bVar3) && (((in_RSI->playing->env_instrument->volume_envelope).flags & 8) != 0)) {
          (in_RSI->playing->volume_envelope).tick = local_14;
        }
        else {
          (in_RSI->playing->volume_envelope).tick = 0;
        }
        if ((bVar3) && (((in_RSI->playing->env_instrument->pan_envelope).flags & 8) != 0)) {
          (in_RSI->playing->pan_envelope).tick = local_18;
        }
        else {
          (in_RSI->playing->pan_envelope).tick = 0;
        }
        if ((bVar3) && (((in_RSI->playing->env_instrument->pitch_envelope).flags & 8) != 0)) {
          (in_RSI->playing->pitch_envelope).tick = local_1c;
        }
        else {
          (in_RSI->playing->pitch_envelope).tick = 0;
        }
        recalculate_it_envelope_nodes((IT_PLAYING *)0x861d1e);
      }
      in_RSI->playing->fadeoutcount = 0x400;
      it_reset_filter_state(in_RSI->playing->filter_state);
      it_reset_filter_state(in_RSI->playing->filter_state + 1);
      it_playing_reset_resamplers((IT_PLAYING *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
      ;
    }
  }
  return;
}

Assistant:

static void it_retrigger_note(DUMB_IT_SIGRENDERER *sigrenderer, IT_CHANNEL *channel)
{
	int vol_env_tick = 0;
	int pan_env_tick = 0;
	int pitch_env_tick = 0;

	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;
	unsigned char nna = ~0;
	int i, envelopes_copied = 0;

	if (channel->playing) {
		if (channel->note == IT_NOTE_CUT)
			nna = NNA_NOTE_CUT;
		else if (channel->note == IT_NOTE_OFF)
			nna = NNA_NOTE_OFF;
		else if (channel->note > 120)
			nna = NNA_NOTE_FADE;
		else if (!channel->playing->instrument || (channel->playing->flags & IT_PLAYING_DEAD))
			nna = NNA_NOTE_CUT;
		else if (channel->new_note_action != 0xFF)
		{
			nna = channel->new_note_action;
		}
		else
			nna = channel->playing->instrument->new_note_action;

		if (!(channel->playing->flags & IT_PLAYING_SUSTAINOFF))
		{
			if (nna != NNA_NOTE_CUT)
				vol_env_tick = channel->playing->volume_envelope.tick;
			pan_env_tick = channel->playing->pan_envelope.tick;
			pitch_env_tick = channel->playing->pitch_envelope.tick;
			envelopes_copied = 1;
		}

		switch (nna) {
			case NNA_NOTE_CUT:
				channel->playing->declick_stage = 3;
				break;
			case NNA_NOTE_OFF:
				it_note_off(channel->playing);
				break;
			case NNA_NOTE_FADE:
				channel->playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_FADING;
				break;
		}
	}

	channel->new_note_action = 0xFF;

	if (channel->sample == 0 || channel->note > 120)
		return;

	channel->destnote = IT_NOTE_OFF;

	if (channel->playing) {
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			if (!sigrenderer->playing[i]) {
				sigrenderer->playing[i] = channel->playing;
				channel->playing = NULL;
				break;
			}
		}

		if (sigrenderer->sigdata->flags & IT_USE_INSTRUMENTS)
		{
			for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
				IT_PLAYING * playing = sigrenderer->playing[i];
				if (playing && playing->channel == channel && playing->instrument->dup_check_type) {
					int match = 1;
					switch (playing->instrument->dup_check_type)
					{
					case DCT_NOTE:
						match = (channel->truenote == playing->note);
					case DCT_SAMPLE:
						match = match && (channel->sample == playing->sampnum);
					case DCT_INSTRUMENT:
						match = match && (channel->instrument == playing->instnum);
						break;
					}

					if (match)
					{
						switch (playing->instrument->dup_check_action)
						{
						case DCA_NOTE_CUT:
							playing->declick_stage = 3;
							if (channel->playing == playing) channel->playing = NULL;
							break;
						case DCA_NOTE_OFF:
							if (!(playing->flags & IT_PLAYING_SUSTAINOFF))
								it_note_off(playing);
							break;
						case DCA_NOTE_FADE:
							playing->flags |= IT_PLAYING_BACKGROUND | IT_PLAYING_FADING;
							break;
						}
					}
				}
			}
		}

/** WARNING - come up with some more heuristics for replacing old notes */
#if 0
		if (channel->playing) {
			for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
				if (sigrenderer->playing[i]->flags & IT_PLAYING_BACKGROUND) {
					write_seqtime();
					sequence_c(SEQUENCE_STOP_SIGNAL);
					sequence_c(i);
					channel->VChannel = &module->VChannel[i];
					break;
				}
			}
		}
#endif
	}

	if (channel->playing)
		free_playing(sigrenderer, channel->playing);

	channel->playing = new_playing(sigrenderer);

	if (!channel->playing)
		return;

	if (!envelopes_copied && sigdata->flags & IT_USE_INSTRUMENTS) {
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			IT_PLAYING * playing = sigrenderer->playing[i];
			if (!playing || playing->channel != channel) continue;
			if (playing->flags & IT_PLAYING_SUSTAINOFF) continue;
			if (nna != NNA_NOTE_CUT)
				vol_env_tick = playing->volume_envelope.tick;
			pan_env_tick = playing->pan_envelope.tick;
			pitch_env_tick = playing->pitch_envelope.tick;
			envelopes_copied = 1;
			break;
		}
	}				

	channel->playing->flags = 0;
	channel->playing->resampling_quality = sigrenderer->resampling_quality;
	channel->playing->channel = channel;
	channel->playing->sample = &sigdata->sample[channel->sample-1];
	if (sigdata->flags & IT_USE_INSTRUMENTS)
		channel->playing->instrument = &sigdata->instrument[channel->instrument-1];
	else
		channel->playing->instrument = NULL;
	channel->playing->env_instrument = channel->playing->instrument;
	channel->playing->sampnum = channel->sample;
	channel->playing->instnum = channel->instrument;
	channel->playing->declick_stage = 0;
	channel->playing->channel_volume = channel->channelvolume;
	channel->playing->note = channel->truenote;
	channel->playing->enabled_envelopes = 0;
	channel->playing->volume_offset = 0;
	channel->playing->panning_offset = 0;
	//channel->playing->output = channel->output;
	if (sigdata->flags & IT_USE_INSTRUMENTS) {
		IT_PLAYING * playing = channel->playing;
		IT_INSTRUMENT * instrument = playing->instrument;
		if (instrument->volume_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_VOLUME;
		if (instrument->pan_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_PANNING;
		if (instrument->pitch_envelope.flags & IT_ENVELOPE_ON) playing->enabled_envelopes |= IT_ENV_PITCH;
		if (instrument->random_volume) playing->volume_offset = (rand() % (instrument->random_volume * 2 + 1)) - instrument->random_volume;
		if (instrument->random_pan) playing->panning_offset = (rand() % (instrument->random_pan * 2 + 1)) - instrument->random_pan;
		//if (instrument->output) playing->output = instrument->output;
	}
	channel->playing->filter_cutoff = 127;
	channel->playing->filter_resonance = 0;
	channel->playing->true_filter_cutoff = 127 << 8;
	channel->playing->true_filter_resonance = 0;
	channel->playing->vibrato_speed = 0;
	channel->playing->vibrato_depth = 0;
	channel->playing->vibrato_n = 0;
	channel->playing->vibrato_time = 0;
	channel->playing->vibrato_waveform = channel->vibrato_waveform;
	channel->playing->tremolo_speed = 0;
	channel->playing->tremolo_depth = 0;
	channel->playing->tremolo_time = 0;
	channel->playing->tremolo_waveform = channel->tremolo_waveform;
	channel->playing->panbrello_speed = 0;
	channel->playing->panbrello_depth = 0;
	channel->playing->panbrello_time = 0;
	channel->playing->panbrello_waveform = channel->panbrello_waveform;
	channel->playing->panbrello_random = 0;
	channel->playing->sample_vibrato_time = 0;
	channel->playing->sample_vibrato_waveform = channel->playing->sample->vibrato_waveform;
	channel->playing->sample_vibrato_depth = 0;
	channel->playing->slide = 0;
	channel->playing->finetune = channel->playing->sample->finetune;

	if (sigdata->flags & IT_USE_INSTRUMENTS)
	{
		if (envelopes_copied && channel->playing->env_instrument->volume_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->volume_envelope.tick = vol_env_tick;
		} else {
			channel->playing->volume_envelope.tick = 0;
		}
		if (envelopes_copied && channel->playing->env_instrument->pan_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->pan_envelope.tick = pan_env_tick;
		} else {
			channel->playing->pan_envelope.tick = 0;
		}
		if (envelopes_copied && channel->playing->env_instrument->pitch_envelope.flags & IT_ENVELOPE_CARRY) {
			channel->playing->pitch_envelope.tick = pitch_env_tick;
		} else {
			channel->playing->pitch_envelope.tick = 0;
		}
		recalculate_it_envelope_nodes(channel->playing);
	}
	channel->playing->fadeoutcount = 1024;
	it_reset_filter_state(&channel->playing->filter_state[0]);
	it_reset_filter_state(&channel->playing->filter_state[1]);
	it_playing_reset_resamplers(channel->playing, 0);

	/** WARNING - is everything initialised? */
}